

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_set_user_reg_aarch64(CPUARMState_conflict *env,uint32_t regno,uint32_t val)

{
  uint32_t val_local;
  uint32_t regno_local;
  CPUARMState_conflict *env_local;
  
  if (regno == 0xd) {
    env->banked_r13[0] = val;
  }
  else if (regno == 0xe) {
    env->banked_r14[0] = val;
  }
  else if ((regno < 8) || ((env->uncached_cpsr & 0x1f) != 0x11)) {
    env->regs[regno] = val;
  }
  else {
    env->usr_regs[regno - 8] = val;
  }
  return;
}

Assistant:

void HELPER(set_user_reg)(CPUARMState *env, uint32_t regno, uint32_t val)
{
    if (regno == 13) {
        env->banked_r13[BANK_USRSYS] = val;
    } else if (regno == 14) {
        env->banked_r14[BANK_USRSYS] = val;
    } else if (regno >= 8
               && (env->uncached_cpsr & 0x1f) == ARM_CPU_MODE_FIQ) {
        env->usr_regs[regno - 8] = val;
    } else {
        env->regs[regno] = val;
    }
}